

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSamplerType_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          )

{
  TextureChannelClass TVar1;
  string *psVar2;
  char *pcVar3;
  ostringstream samplerType;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar3 = "u";
  }
  else {
    TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_0048364a;
    pcVar3 = "i";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,1);
LAB_0048364a:
  if ((uint)format < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               &DAT_00ab1ad4 + *(int *)(&DAT_00ab1ad4 + ((ulong)format & 0xffffffff) * 4),
               *(long *)(&DAT_00ab1af0 + ((ulong)format & 0xffffffff) * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

std::string ImageTest::getGlslSamplerType (const tcu::TextureFormat& format, VkImageViewType type)
{
	std::ostringstream samplerType;

	if (tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		samplerType << "u";
	else if (tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		samplerType << "i";

	switch (type)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			samplerType << "sampler1D";
			break;

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			samplerType << "sampler1DArray";
			break;

		case VK_IMAGE_VIEW_TYPE_2D:
			samplerType << "sampler2D";
			break;

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			samplerType << "sampler2DArray";
			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			samplerType << "sampler3D";
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
			samplerType << "samplerCube";
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			samplerType << "samplerCubeArray";
			break;

		default:
			DE_FATAL("Unknown image view type");
			break;
	}

	return samplerType.str();
}